

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelineGenDrawCommands::Run(AdvancedPipelineGenDrawCommands *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint location;
  int iVar3;
  float *pfVar4;
  byte local_4b1;
  Vector<float,_3> local_424;
  Vector<float,_3> local_418;
  Vector<float,_3> local_40c;
  Vector<float,_3> local_400;
  int local_3f4;
  void *pvStack_3f0;
  int i;
  GLsizeiptr offset;
  GLushort data_2 [16];
  vec3 data_1 [32];
  Vector<float,_3> local_240;
  Vector<float,_3> local_234;
  Vector<float,_3> local_228;
  Vector<float,_3> local_21c;
  float *local_210;
  undefined1 local_204 [8];
  anon_struct_288_3_02a68abf data;
  allocator<char> local_b9;
  string local_b8;
  char *local_98;
  char *glsl_fs;
  char *glsl_vs;
  string local_80;
  char *local_60;
  char *glsl_cs;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  AdvancedPipelineGenDrawCommands *pAStack_18;
  GLint res;
  AdvancedPipelineGenDrawCommands *this_local;
  
  pAStack_18 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d6,&local_1c);
  if (local_1c < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0",&local_41);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local = (AdvancedPipelineGenDrawCommands *)0x0;
  }
  else {
    local_60 = 
    "\nlayout(local_size_x = 4) in;\nstruct DrawCommand {\n  uint count;\n  uint instance_count;\n  uint first_index;\n  int base_vertex;\n  uint base_instance;\n};\nlayout(std430) buffer;\nlayout(binding = 0) readonly buffer ObjectBuffer {\n  mat4 transform[4];\n  uint count[4];\n  uint first_index[4];\n} g_objects;\nlayout(binding = 1) writeonly buffer DrawCommandBuffer {\n  DrawCommand g_command[4];\n};\nbool IsObjectVisible(uint id) {\n  if (g_objects.transform[id][3].x < -1.0 || g_objects.transform[id][3].x > 1.0) return false;\n  if (g_objects.transform[id][3][1] < -1.0 || g_objects.transform[id][3][1] > 1.0) return false;\n  if (g_objects.transform[id][3][2] < -1.0 || g_objects.transform[id][3].z > 1.0) return false;\n  return true;\n}\nvoid main() {\n  uint id = gl_GlobalInvocationID.x;\n  g_command[id].count = 0;\n  g_command[id].instance_count = 0;\n  g_command[id].first_index = 0;\n  g_command[id].base_vertex = 0;\n  g_command[id].base_instance = 0;\n  if (IsObjectVisible(id)) {\n    g_command[id].count = g_objects.count[id];\n    g_command[id].instance_count = 1;\n    g_command[id].first_index = g_objects.first_index[id];\n  }\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "\nlayout(local_size_x = 4) in;\nstruct DrawCommand {\n  uint count;\n  uint instance_count;\n  uint first_index;\n  int base_vertex;\n  uint base_instance;\n};\nlayout(std430) buffer;\nlayout(binding = 0) readonly buffer ObjectBuffer {\n  mat4 transform[4];\n  uint count[4];\n  uint first_index[4];\n} g_objects;\nlayout(binding = 1) writeonly buffer DrawCommandBuffer {\n  DrawCommand g_command[4];\n};\nbool IsObjectVisible(uint id) {\n  if (g_objects.transform[id][3].x < -1.0 || g_objects.transform[id][3].x > 1.0) return false;\n  if (g_objects.transform[id][3][1] < -1.0 || g_objects.transform[id][3][1] > 1.0) return false;\n  if (g_objects.transform[id][3][2] < -1.0 || g_objects.transform[id][3].z > 1.0) return false;\n  return true;\n}\nvoid main() {\n  uint id = gl_GlobalInvocationID.x;\n  g_command[id].count = 0;\n  g_command[id].instance_count = 0;\n  g_command[id].first_index = 0;\n  g_command[id].base_vertex = 0;\n  g_command[id].base_instance = 0;\n  if (IsObjectVisible(id)) {\n    g_command[id].count = g_objects.count[id];\n    g_command[id].instance_count = 1;\n    g_command[id].first_index = g_objects.first_index[id];\n  }\n}"
               ,(allocator<char> *)((long)&glsl_vs + 7));
    GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_80);
    this->m_program[0] = GVar2;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&glsl_vs + 7));
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[0]);
    bVar1 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[0],(bool *)0x0);
    if (bVar1) {
      glsl_fs = 
      "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec3 g_color;\nout StageData {\n  vec3 color;\n} g_vs_out;\nlayout(binding = 0, std430) buffer ObjectBuffer {\n  mat4 transform[4];\n  uint count[4];\n  uint first_index[4];\n} g_objects;\nuniform int g_object_id;\nvoid main() {\n  gl_Position = g_objects.transform[g_object_id] * g_position;\n  g_vs_out.color = g_color;\n}"
      ;
      local_98 = 
      "\nin StageData {\n  vec3 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(g_fs_in.color, 1);\n}"
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec3 g_color;\nout StageData {\n  vec3 color;\n} g_vs_out;\nlayout(binding = 0, std430) buffer ObjectBuffer {\n  mat4 transform[4];\n  uint count[4];\n  uint first_index[4];\n} g_objects;\nuniform int g_object_id;\nvoid main() {\n  gl_Position = g_objects.transform[g_object_id] * g_position;\n  g_vs_out.color = g_color;\n}"
                 ,&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(data.first_index + 3),
                 "\nin StageData {\n  vec3 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(g_fs_in.color, 1);\n}"
                 ,(allocator<char> *)((long)data.first_index + 0xb));
      GVar2 = ComputeShaderBase::CreateProgram
                        (&this->super_ComputeShaderBase,&local_b8,(string *)(data.first_index + 3));
      this->m_program[1] = GVar2;
      std::__cxx11::string::~string((string *)(data.first_index + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)data.first_index + 0xb));
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[1]);
      bVar1 = ComputeShaderBase::CheckProgram
                        (&this->super_ComputeShaderBase,this->m_program[1],(bool *)0x0);
      if (bVar1) {
        glu::CallLogWrapper::glViewport
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0,100,100);
        local_210 = (float *)local_204;
        tcu::Vector<float,_3>::Vector(&local_21c,-1.5,-0.5,0.0);
        tcu::translationMatrix<float,_3>((Matrix<float,_4,_4> *)local_204,&local_21c);
        pfVar4 = data.transform[0].m_data.m_data[3].m_data + 2;
        local_210 = pfVar4;
        tcu::Vector<float,_3>::Vector(&local_228,0.5,-0.5,0.0);
        tcu::translationMatrix<float,_3>((Matrix<float,_4,_4> *)pfVar4,&local_228);
        pfVar4 = data.transform[1].m_data.m_data[3].m_data + 2;
        local_210 = pfVar4;
        tcu::Vector<float,_3>::Vector(&local_234,-0.5,0.5,0.0);
        tcu::translationMatrix<float,_3>((Matrix<float,_4,_4> *)pfVar4,&local_234);
        pfVar4 = data.transform[2].m_data.m_data[3].m_data + 2;
        local_210 = pfVar4;
        tcu::Vector<float,_3>::Vector(&local_240,0.5,0.5,0.0);
        tcu::translationMatrix<float,_3>((Matrix<float,_4,_4> *)pfVar4,&local_240);
        data.transform[3].m_data.m_data[3].m_data[2] = 5.60519e-45;
        data.transform[3].m_data.m_data[3].m_data[3] = 5.60519e-45;
        data.count[0] = 4;
        data.count[1] = 4;
        data.count[2] = 0;
        data.count[3] = 4;
        data.first_index[0] = 8;
        data.first_index[1] = 0xc;
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_object_buffer);
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,this->m_object_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0x120,local_204,0x88e4);
        gl4cts::(anonymous_namespace)::AdvancedPipelineGenDrawCommands::Run()::$_0::~__0
                  ((__0 *)local_204);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_2 + 0xc),-0.4,-0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0].m_data + 1),1.0,0.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[1].m_data + 1),0.4,-0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[2].m_data + 1),1.0,0.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[3].m_data + 1),-0.4,0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[4].m_data + 1),1.0,0.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[5].m_data + 1),0.4,0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[6].m_data + 1),1.0,0.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[7].m_data + 1),-0.4,-0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[8].m_data + 1),0.0,1.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[9].m_data + 1),0.4,-0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[10].m_data + 1),0.0,1.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0xb].m_data + 1),-0.4,0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0xc].m_data + 1),0.0,1.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0xd].m_data + 1),0.4,0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0xe].m_data + 1),0.0,1.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0xf].m_data + 1),-0.4,-0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x10].m_data + 1),0.0,0.0,1.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x11].m_data + 1),0.4,-0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x12].m_data + 1),0.0,0.0,1.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x13].m_data + 1),-0.4,0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x14].m_data + 1),0.0,0.0,1.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x15].m_data + 1),0.4,0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x16].m_data + 1),0.0,0.0,1.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x17].m_data + 1),-0.4,-0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x18].m_data + 1),1.0,1.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x19].m_data + 1),0.4,-0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x1a].m_data + 1),1.0,1.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x1b].m_data + 1),-0.4,0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x1c].m_data + 1),1.0,1.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x1d].m_data + 1),0.4,0.4,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(data_1[0x1e].m_data + 1),1.0,1.0,0.0);
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_vertex_buffer);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0x180,data_2 + 0xc,0x88e4);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        offset = 0x3000200010000;
        data_2[0] = 4;
        data_2[1] = 5;
        data_2[2] = 6;
        data_2[3] = 7;
        data_2[4] = 8;
        data_2[5] = 9;
        data_2[6] = 10;
        data_2[7] = 0xb;
        data_2[8] = 0xc;
        data_2[9] = 0xd;
        data_2[10] = 0xe;
        data_2[0xb] = 0xf;
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_index_buffer);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8893,this->m_index_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8893,0x20,&offset,0x88e8);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8893,0);
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_draw_buffer);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8f3f,this->m_draw_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8f3f,0x50,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8f3f,0);
        glu::CallLogWrapper::glGenVertexArrays
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vertex_array);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glVertexAttribPointer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,3,0x1406,'\0',0x18,(void *)0x0);
        glu::CallLogWrapper::glVertexAttribPointer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,3,0x1406,'\0',0x18,(void *)0xc);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8893,this->m_index_buffer);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,1,this->m_draw_buffer);
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_program[0]);
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,1,1);
        glu::CallLogWrapper::glClear
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x4000);
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_program[1]);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vertex_array);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8f3f,this->m_draw_buffer);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x40);
        pvStack_3f0 = (void *)0x0;
        for (local_3f4 = 0; local_3f4 < 4; local_3f4 = local_3f4 + 1) {
          location = glu::CallLogWrapper::glGetUniformLocation
                               (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                 super_CallLogWrapper,this->m_program[1],"g_object_id");
          glu::CallLogWrapper::glUniform1i
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,location,local_3f4);
          glu::CallLogWrapper::glDrawElementsIndirect
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,5,0x1403,pvStack_3f0);
          pvStack_3f0 = (void *)((long)pvStack_3f0 + 0x14);
        }
        iVar3 = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
        local_4b1 = 0;
        if (99 < iVar3) {
          iVar3 = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
          local_4b1 = 0;
          if (99 < iVar3) {
            tcu::Vector<float,_3>::Vector(&local_400,0.0);
            tcu::Vector<float,_3>::Vector(&local_40c,0.0,1.0,0.0);
            tcu::Vector<float,_3>::Vector(&local_418,1.0,1.0,0.0);
            tcu::Vector<float,_3>::Vector(&local_424,0.0,0.0,1.0);
            bVar1 = ComputeShaderBase::ValidateWindow4Quads
                              (&this->super_ComputeShaderBase,&local_400,&local_40c,&local_418,
                               &local_424);
            local_4b1 = bVar1 ^ 0xff;
          }
        }
        if ((local_4b1 & 1) == 0) {
          this_local = (AdvancedPipelineGenDrawCommands *)0x0;
        }
        else {
          this_local = (AdvancedPipelineGenDrawCommands *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedPipelineGenDrawCommands *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedPipelineGenDrawCommands *)&DAT_ffffffffffffffff;
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLint res;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &res);
		if (res <= 0)
		{
			OutputNotSupported("GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0");
			return NO_ERROR;
		}

		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "struct DrawCommand {" NL "  uint count;" NL
			   "  uint instance_count;" NL "  uint first_index;" NL "  int base_vertex;" NL "  uint base_instance;" NL
			   "};" NL "layout(std430) buffer;" NL "layout(binding = 0) readonly buffer ObjectBuffer {" NL
			   "  mat4 transform[4];" NL "  uint count[4];" NL "  uint first_index[4];" NL "} g_objects;" NL
			   "layout(binding = 1) writeonly buffer DrawCommandBuffer {" NL "  DrawCommand g_command[4];" NL "};" NL
			   "bool IsObjectVisible(uint id) {" NL
			   "  if (g_objects.transform[id][3].x < -1.0 || g_objects.transform[id][3].x > 1.0) return false;" NL
			   "  if (g_objects.transform[id][3][1] < -1.0 || g_objects.transform[id][3][1] > 1.0) return false;" NL
			   "  if (g_objects.transform[id][3][2] < -1.0 || g_objects.transform[id][3].z > 1.0) return false;" NL
			   "  return true;" NL "}" NL "void main() {" NL "  uint id = gl_GlobalInvocationID.x;" NL
			   "  g_command[id].count = 0;" NL "  g_command[id].instance_count = 0;" NL
			   "  g_command[id].first_index = 0;" NL "  g_command[id].base_vertex = 0;" NL
			   "  g_command[id].base_instance = 0;" NL "  if (IsObjectVisible(id)) {" NL
			   "    g_command[id].count = g_objects.count[id];" NL "    g_command[id].instance_count = 1;" NL
			   "    g_command[id].first_index = g_objects.first_index[id];" NL "  }" NL "}";
		m_program[0] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "layout(location = 1) in vec3 g_color;" NL
			   "out StageData {" NL "  vec3 color;" NL "} g_vs_out;" NL
			   "layout(binding = 0, std430) buffer ObjectBuffer {" NL "  mat4 transform[4];" NL "  uint count[4];" NL
			   "  uint first_index[4];" NL "} g_objects;" NL "uniform int g_object_id;" NL "void main() {" NL
			   "  gl_Position = g_objects.transform[g_object_id] * g_position;" NL "  g_vs_out.color = g_color;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec3 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_color;" NL
			   "void main() {" NL "  g_color = vec4(g_fs_in.color, 1);" NL "}";
		m_program[1] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;
		glViewport(0, 0, 100, 100);

		/* object buffer */
		{
			struct
			{
				mat4   transform[4];
				GLuint count[4];
				GLuint first_index[4];
			} data = {
				{ tcu::translationMatrix(vec3(-1.5f, -0.5f, 0.0f)), tcu::translationMatrix(vec3(0.5f, -0.5f, 0.0f)),
				  tcu::translationMatrix(vec3(-0.5f, 0.5f, 0.0f)), tcu::translationMatrix(vec3(0.5f, 0.5f, 0.0f)) },
				{ 4, 4, 4, 4 },
				{ 0, 4, 8, 12 }
			};
			glGenBuffers(1, &m_object_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_object_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		/* vertex buffer */
		{
			const vec3 data[] = { vec3(-0.4f, -0.4f, 0.0f), vec3(1, 0, 0), vec3(0.4f, -0.4f, 0.0f), vec3(1, 0, 0),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(1, 0, 0), vec3(0.4f, 0.4f, 0.0f),  vec3(1, 0, 0),
								  vec3(-0.4f, -0.4f, 0.0f), vec3(0, 1, 0), vec3(0.4f, -0.4f, 0.0f), vec3(0, 1, 0),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(0, 1, 0), vec3(0.4f, 0.4f, 0.0f),  vec3(0, 1, 0),
								  vec3(-0.4f, -0.4f, 0.0f), vec3(0, 0, 1), vec3(0.4f, -0.4f, 0.0f), vec3(0, 0, 1),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(0, 0, 1), vec3(0.4f, 0.4f, 0.0f),  vec3(0, 0, 1),
								  vec3(-0.4f, -0.4f, 0.0f), vec3(1, 1, 0), vec3(0.4f, -0.4f, 0.0f), vec3(1, 1, 0),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(1, 1, 0), vec3(0.4f, 0.4f, 0.0f),  vec3(1, 1, 0) };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		/* index buffer */
		{
			const GLushort data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };
			glGenBuffers(1, &m_index_buffer);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		glGenBuffers(1, &m_draw_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_buffer);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 4 * sizeof(GLuint) * 5, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 2 * sizeof(vec3), 0);
		glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, 2 * sizeof(vec3), reinterpret_cast<void*>(sizeof(vec3)));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
		glBindVertexArray(0);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_draw_buffer);
		glUseProgram(m_program[0]);
		glDispatchCompute(1, 1, 1);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_buffer);
		glMemoryBarrier(GL_COMMAND_BARRIER_BIT);
		/* draw (CPU draw calls dispatch, could be done by the GPU with ARB_multi_draw_indirect) */
		{
			GLsizeiptr offset = 0;
			for (int i = 0; i < 4; ++i)
			{
				glUniform1i(glGetUniformLocation(m_program[1], "g_object_id"), i);
				glDrawElementsIndirect(GL_TRIANGLE_STRIP, GL_UNSIGNED_SHORT, reinterpret_cast<void*>(offset));
				offset += 5 * sizeof(GLuint);
			}
		}
		if (getWindowWidth() >= 100 && getWindowHeight() >= 100 &&
			!ValidateWindow4Quads(vec3(0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}